

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O2

void fe_bundle_free(fe_bundle *bundle)

{
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < bundle->num; lVar2 = lVar2 + 1) {
    fe_effect_free((fe_effect *)(bundle->effect->id + lVar1));
    lVar1 = lVar1 + 0x268;
  }
  _fe_free(bundle->effect);
  _fe_free(bundle);
  return;
}

Assistant:

void fe_bundle_free(fe_bundle* bundle)
{
    for (int i = 0; i < bundle->num; ++i)
    {
        fe_effect* ef = &bundle->effect[i];
        fe_effect_free(ef);
    }

    _fe_free(bundle->effect);
    _fe_free(bundle);
}